

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O3

enable_if_t<std::is_arithmetic<unsigned_char>::value,_bool> __thiscall
beast::detail::LexicalCast<std::__cxx11::string,unsigned_char>::operator()
          (void *this,string *out,uchar in)

{
  undefined7 in_register_00000011;
  uint __len;
  long *local_48 [2];
  long local_38 [2];
  
  __len = 1;
  if (9 < in) {
    __len = 3 - (in < 100);
  }
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)local_48[0],__len,(uint)CONCAT71(in_register_00000011,in));
  std::__cxx11::string::operator=((string *)out,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return true;
}

Assistant:

std::enable_if_t <std::is_arithmetic <Arithmetic>::value, bool>
    operator () (std::string& out, Arithmetic in)
    {
        out = std::to_string (in);
        return true;
    }